

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::WindingCase::init(WindingCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  Context *this_00;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar2;
  RenderTarget *renderTarget;
  long *plVar3;
  SharedPtrStateBase *pSVar4;
  ContextInfo *extraout_RAX;
  ContextInfo *pCVar5;
  TestError *this_01;
  pointer pbVar6;
  ShaderProgram *pSVar7;
  _Base_ptr p_Var8;
  size_type *psVar9;
  Context *code;
  long lVar10;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string local_2a8;
  string local_288;
  Context *local_268;
  undefined8 local_260;
  Context local_258;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_230;
  pointer local_220;
  value_type local_218;
  ShaderProgram *local_1f8;
  ShaderProgram *local_1f0;
  value_type local_1e8;
  _Base_ptr local_1c8;
  value_type local_1c0;
  Context *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  ContextInfo *local_180;
  undefined1 local_170 [16];
  ContextInfo *local_160;
  undefined1 local_150 [24];
  pointer local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x40);
  local_160 = (ContextInfo *)local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,"${GLSL_VERSION_DECL}\n\nvoid main (void)\n{\n}\n","");
  local_180 = (ContextInfo *)local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = 5.0;\n\tgl_TessLevelInner[1] = 5.0;\n\n\tgl_TessLevelOuter[0] = 5.0;\n\tgl_TessLevelOuter[1] = 5.0;\n\tgl_TessLevelOuter[2] = 5.0;\n\tgl_TessLevelOuter[3] = 5.0;\n}\n"
             ,"");
  local_268 = &local_258;
  local_260 = 0;
  local_258.m_testCtx._0_1_ = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_268);
  pbVar6 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pbVar6) {
    local_218._M_string_length = (size_type)(pbVar6->_M_dataplus)._M_p;
    local_218.field_2._M_allocated_capacity = plVar3[3];
    local_220 = (pointer)&local_218._M_string_length;
  }
  else {
    local_218._M_string_length = (size_type)(pbVar6->_M_dataplus)._M_p;
    local_220 = (pointer)*plVar3;
  }
  local_218._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)pbVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_220);
  pSVar7 = (ShaderProgram *)(plVar3 + 2);
  if ((ShaderProgram *)*plVar3 == pSVar7) {
    local_1e8._M_string_length =
         *(size_type *)
          &pSVar7->m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl;
    local_1e8.field_2._M_allocated_capacity = plVar3[3];
    local_1f0 = (ShaderProgram *)&local_1e8._M_string_length;
  }
  else {
    local_1e8._M_string_length =
         *(size_type *)
          &pSVar7->m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl;
    local_1f0 = (ShaderProgram *)*plVar3;
  }
  local_1e8._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)pSVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  p_Var8 = (_Base_ptr)(plVar3 + 2);
  if ((_Base_ptr)*plVar3 == p_Var8) {
    local_1c0._M_string_length = *(size_type *)p_Var8;
    local_1c0.field_2._M_allocated_capacity = plVar3[3];
    local_1c8 = (_Base_ptr)&local_1c0._M_string_length;
  }
  else {
    local_1c0._M_string_length = *(size_type *)p_Var8;
    local_1c8 = (_Base_ptr)*plVar3;
  }
  local_1c0._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)p_Var8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  pCVar5 = (ContextInfo *)(plVar3 + 2);
  if ((ContextInfo *)*plVar3 == pCVar5) {
    local_240._8_8_ = pCVar5->_vptr_ContextInfo;
    aStack_230._M_allocated_capacity = plVar3[3];
    local_258.m_contextInfo = (ContextInfo *)(local_240 + 8);
  }
  else {
    local_240._8_8_ = pCVar5->_vptr_ContextInfo;
    local_258.m_contextInfo = (ContextInfo *)*plVar3;
  }
  local_240._0_8_ = plVar3[1];
  *plVar3 = (long)pCVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_258.m_contextInfo);
  p_Var8 = (_Base_ptr)(plVar3 + 2);
  if ((_Base_ptr)*plVar3 == p_Var8) {
    local_100._16_8_ = *(undefined8 *)p_Var8;
    pbStack_e8 = (pointer)plVar3[3];
    local_100._0_8_ = (_Base_ptr)(local_100 + 0x10);
  }
  else {
    local_100._16_8_ = *(undefined8 *)p_Var8;
    local_100._0_8_ = (_Base_ptr)*plVar3;
  }
  local_100._8_8_ = plVar3[1];
  *plVar3 = (long)p_Var8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_100);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  psVar9 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2a8.field_2._M_allocated_capacity = *psVar9;
    local_2a8.field_2._8_8_ = plVar3[3];
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar9;
    local_2a8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_2a8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((_Base_ptr)local_100._0_8_ != (_Base_ptr)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_258.m_contextInfo != (ContextInfo *)(local_240 + 8)) {
    operator_delete(local_258.m_contextInfo,local_240._8_8_ + 1);
  }
  if (local_1c8 != (_Base_ptr)&local_1c0._M_string_length) {
    operator_delete(local_1c8,local_1c0._M_string_length + 1);
  }
  if (local_1f0 != (ShaderProgram *)&local_1e8._M_string_length) {
    operator_delete(local_1f0,local_1e8._M_string_length + 1);
  }
  if (local_220 != (pointer)&local_218._M_string_length) {
    operator_delete(local_220,(ulong)(local_218._M_string_length + 1));
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(local_258.m_testCtx._1_7_,local_258.m_testCtx._0_1_) + 1);
  }
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x96eea1);
  psVar9 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_288.field_2._M_allocated_capacity = *psVar9;
    local_288.field_2._8_8_ = plVar3[3];
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar9;
    local_288._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_288._M_string_length = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_1a0 = (Context *)local_190;
  code = (Context *)(plVar3 + 2);
  if ((Context *)*plVar3 == code) {
    local_190._0_8_ = code->m_testCtx;
    local_190._8_8_ = plVar3[3];
  }
  else {
    local_190._0_8_ = code->m_testCtx;
    local_1a0 = (Context *)*plVar3;
  }
  local_198 = plVar3[1];
  *plVar3 = (long)code;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(1.0);\n}\n"
             ,"");
  local_1f8 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_288,(_anonymous_namespace_ *)this_00,(Context *)local_160,(char *)code);
  local_258.m_contextInfo = (ContextInfo *)((ulong)local_258.m_contextInfo & 0xffffffff00000000);
  local_240._0_8_ = &aStack_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_288._M_dataplus._M_p,
             local_288._M_dataplus._M_p + local_288._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_258.m_contextInfo & 0xffffffff) * 0x18),
              (value_type *)local_240);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_180,(char *)code);
  local_1c8 = (_Base_ptr)CONCAT44(local_1c8._4_4_,3);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_2a8._M_dataplus._M_p,
             local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_1c8 & 0xffffffff) * 0x18),&local_1c0);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_1a0,
             (char *)code);
  local_1f0 = (ShaderProgram *)CONCAT44(local_1f0._4_4_,4);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_120._M_dataplus._M_p,
             local_120._M_dataplus._M_p + local_120._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_1f0 & 0xffffffff) * 0x18),&local_1e8);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_150 + 0x10),(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             local_268,(char *)code);
  local_220 = (pointer)CONCAT44(local_220._4_4_,1);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,local_150._16_8_,
             (long)&(local_138->_M_dataplus)._M_p + local_150._16_8_);
  pSVar7 = local_1f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_220 & 0xffffffff) * 0x18),&local_218);
  glu::ShaderProgram::ShaderProgram(pSVar7,renderCtx,(ProgramSources *)local_100);
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b47b90;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSVar2 = (this->m_program).m_state;
  if (pSVar2 != pSVar4) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_program).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_program).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = pSVar7;
    (this->m_program).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar4->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar4->_vptr_SharedPtrStateBase[2])(pSVar4);
  }
  LOCK();
  pdVar1 = &pSVar4->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar4->_vptr_SharedPtrStateBase[1])(pSVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._16_8_ != &local_130) {
    operator_delete((void *)local_150._16_8_,local_130._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._0_8_ != &aStack_230) {
    operator_delete((void *)local_240._0_8_,aStack_230._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_268 != &local_258) {
      operator_delete(local_268,CONCAT71(local_258.m_testCtx._1_7_,local_258.m_testCtx._0_1_) + 1);
    }
    if (local_1a0 != (Context *)local_190) {
      operator_delete(local_1a0,(ulong)((long)(Platform **)local_190._0_8_ + 1));
    }
    if (local_180 != (ContextInfo *)local_170) {
      operator_delete(local_180,(ulong)((long)(Platform **)local_170._0_8_ + 1));
    }
    pCVar5 = (ContextInfo *)local_150;
    if (local_160 != pCVar5) {
      operator_delete(local_160,(ulong)((long)(Platform **)local_150._0_8_ + 1));
      pCVar5 = extraout_RAX;
    }
    return (int)pCVar5;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xae0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void WindingCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = 1) out;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													 "	gl_TessLevelOuter[0] = 5.0;\n"
													 "	gl_TessLevelOuter[1] = 5.0;\n"
													 "	gl_TessLevelOuter[2] = 5.0;\n"
													 "	gl_TessLevelOuter[3] = 5.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_winding) +
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	gl_Position = vec4(gl_TessCoord.xy*2.0 - 1.0, 0.0, 1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0);\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}